

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_MeshCacheItem * __thiscall ON_MeshCache::Internal_FindHelper(ON_MeshCache *this,ON_UUID mesh_id)

{
  uint uVar1;
  ON_MeshCacheItem *b;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ON_MeshCacheItem *pOVar7;
  ON_MeshCacheItem *local_48;
  ON_UUID mesh_id_local;
  
  mesh_id_local.Data4 = mesh_id.Data4;
  mesh_id_local._0_8_ = mesh_id._0_8_;
  bVar3 = ::operator==(&FineMeshId,&mesh_id_local);
  uVar5 = 0;
  bVar4 = false;
  if (!bVar3) {
    bVar4 = ::operator==(&CoarseMeshId,&mesh_id_local);
    bVar4 = !bVar4;
  }
  uVar6 = 0xffffffff;
  pOVar7 = (ON_MeshCacheItem *)0x0;
  local_48 = (ON_MeshCacheItem *)0x0;
  while( true ) {
    b = this->m_impl;
    if (b == (ON_MeshCacheItem *)0x0) {
      bVar4 = ::operator==(&CoarseMeshId,&mesh_id_local);
      if (!bVar4) {
        bVar4 = ::operator==(&FineMeshId,&mesh_id_local);
        pOVar7 = (ON_MeshCacheItem *)0x0;
        if (bVar4) {
          pOVar7 = local_48;
        }
      }
      return pOVar7;
    }
    bVar3 = ::operator==(&mesh_id_local,&b->m_mesh_id);
    if (bVar3) break;
    if ((((!bVar4) &&
         (peVar2 = (b->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         peVar2 != (element_type *)0x0)) && (uVar1 = (peVar2->m_F).m_count, uVar1 != 0)) &&
       (2 < (uint)(peVar2->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
      if (uVar5 < uVar1) {
        uVar5 = uVar1;
        local_48 = b;
      }
      if (uVar1 < uVar6) {
        pOVar7 = b;
        uVar6 = uVar1;
      }
    }
    this = (ON_MeshCache *)&b->m_next;
  }
  return b;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_FindHelper(
  ON_UUID mesh_id
  ) const
{
  unsigned int coarse_mesh_face_count = 0xFFFFFFFFU;
  unsigned int fine_mesh_face_count = 0;
  ON_MeshCacheItem* item_coarse_mesh = nullptr;
  ON_MeshCacheItem* item_fine_mesh = nullptr;

  const bool bCountFaces = (ON_MeshCache::FineMeshId == mesh_id || ON_MeshCache::CoarseMeshId == mesh_id);

  for (ON_MeshCacheItem* item = m_impl; nullptr != item; item = item->m_next)
  {
    if (mesh_id == item->m_mesh_id)
      return item;
    if (false == bCountFaces)
      continue;
    const ON_Mesh* mesh = item->m_mesh_sp.get();
    if (nullptr == mesh)
      continue;
    unsigned int mesh_face_count = mesh->FaceUnsignedCount();
    if (mesh_face_count <= 0 || mesh->VertexUnsignedCount() < 3)
      continue;
    if (mesh_face_count > fine_mesh_face_count)
    {
      item_fine_mesh = item;
      fine_mesh_face_count = mesh_face_count;
    }
    if (mesh_face_count < coarse_mesh_face_count)
    {
      item_coarse_mesh = item;
      coarse_mesh_face_count = mesh_face_count;
    }
  }
  
  if (ON_MeshCache::CoarseMeshId == mesh_id)
    return item_coarse_mesh;
  
  if (ON_MeshCache::FineMeshId == mesh_id)
    return item_fine_mesh;

  return nullptr;
}